

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * contextMalloc(sqlite3_context *context,i64 nByte)

{
  void *pvVar1;
  
  if (context->pOut->db->aLimit[0] < nByte) {
    context->isError = 0x12;
    context->fErrorOrAux = '\x01';
    pvVar1 = (void *)0x0;
    sqlite3VdbeMemSetStr
              (context->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
  }
  else {
    pvVar1 = sqlite3Malloc(nByte);
    if (pvVar1 == (void *)0x0) {
      sqlite3_result_error_nomem(context);
      pvVar1 = (void *)0x0;
    }
  }
  return pvVar1;
}

Assistant:

static void *contextMalloc(sqlite3_context *context, i64 nByte){
  char *z;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( nByte>0 );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH] );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  if( nByte>db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    z = 0;
  }else{
    z = sqlite3Malloc(nByte);
    if( !z ){
      sqlite3_result_error_nomem(context);
    }
  }
  return z;
}